

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall TPZFMatrix<long>::ClassId(TPZFMatrix<long> *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZFMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZMatrix<long>::ClassId(&this->super_TPZMatrix<long>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFMatrix<TVar>::ClassId() const{
    return Hash("TPZFMatrix") ^ TPZMatrix<TVar>::ClassId() << 1;
}